

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

void __thiscall QFusionStyle::polish(QFusionStyle *this,QWidget *widget)

{
  QAbstractButton *pQVar1;
  QComboBox *pQVar2;
  QProgressBar *pQVar3;
  QScrollBar *pQVar4;
  QSplitterHandle *pQVar5;
  QAbstractSlider *pQVar6;
  QAbstractSpinBox *pQVar7;
  long lVar8;
  
  QCommonStyle::polish(&this->super_QCommonStyle,widget);
  pQVar1 = QtPrivate::qobject_cast_helper<QAbstractButton*,QObject>(&widget->super_QObject);
  if (pQVar1 == (QAbstractButton *)0x0) {
    pQVar2 = QtPrivate::qobject_cast_helper<QComboBox*,QObject>(&widget->super_QObject);
    if (pQVar2 == (QComboBox *)0x0) {
      pQVar3 = QtPrivate::qobject_cast_helper<QProgressBar*,QObject>(&widget->super_QObject);
      if (pQVar3 == (QProgressBar *)0x0) {
        pQVar4 = QtPrivate::qobject_cast_helper<QScrollBar*,QObject>(&widget->super_QObject);
        if (pQVar4 == (QScrollBar *)0x0) {
          pQVar5 = QtPrivate::qobject_cast_helper<QSplitterHandle*,QObject>(&widget->super_QObject);
          if (pQVar5 == (QSplitterHandle *)0x0) {
            pQVar6 = QtPrivate::qobject_cast_helper<QAbstractSlider*,QObject>
                               (&widget->super_QObject);
            if (pQVar6 == (QAbstractSlider *)0x0) {
              pQVar7 = QtPrivate::qobject_cast_helper<QAbstractSpinBox*,QObject>
                                 (&widget->super_QObject);
              if (pQVar7 == (QAbstractSpinBox *)0x0) {
                lVar8 = (**(code **)(*(long *)widget + 8))(widget,"QDockSeparator");
                if (lVar8 == 0) {
                  lVar8 = (**(code **)(*(long *)widget + 8))(widget,"QDockWidgetSeparator");
                  if (lVar8 == 0) {
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QWidget::setAttribute(widget,WA_Hover,true);
  QWidget::setAttribute(widget,WA_OpaquePaintEvent,false);
  return;
}

Assistant:

void QFusionStyle::polish(QWidget *widget)
{
    QCommonStyle::polish(widget);
    if (false
#if QT_CONFIG(abstractbutton)
            || qobject_cast<QAbstractButton*>(widget)
#endif
#if QT_CONFIG(combobox)
            || qobject_cast<QComboBox *>(widget)
#endif
#if QT_CONFIG(progressbar)
            || qobject_cast<QProgressBar *>(widget)
#endif
#if QT_CONFIG(scrollbar)
            || qobject_cast<QScrollBar *>(widget)
#endif
#if QT_CONFIG(splitter)
            || qobject_cast<QSplitterHandle *>(widget)
#endif
#if QT_CONFIG(abstractslider)
            || qobject_cast<QAbstractSlider *>(widget)
#endif
#if QT_CONFIG(spinbox)
            || qobject_cast<QAbstractSpinBox *>(widget)
#endif
            || (widget->inherits("QDockSeparator"))
            || (widget->inherits("QDockWidgetSeparator"))
            ) {
        widget->setAttribute(Qt::WA_Hover, true);
        widget->setAttribute(Qt::WA_OpaquePaintEvent, false);
    }
}